

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O3

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>::compute_median
          (Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>
           *this,vector<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                 *maps)

{
  pointer ppPVar1;
  pointer pdVar2;
  Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function> *pPVar3;
  double dVar4;
  pointer pvVar5;
  ulong uVar6;
  pointer pvVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  vector<double,_std::allocator<double>_> to_compute_median;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  heat_maps;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  check_and_initialize_maps(&local_48,this,maps);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,
             (long)(maps->
                   super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(maps->
                   super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,&local_61);
  if (local_48.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar12 = 0;
    pvVar5 = local_48.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = local_48.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pvVar5[lVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar5[lVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar9 = 0;
        do {
          ppPVar1 = (maps->
                    super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar8 = (long)(maps->
                        super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1;
          if (lVar8 != 0) {
            lVar10 = 0;
            do {
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] =
                   *(double *)
                    (*(long *)(*(long *)&(ppPVar1[lVar10]->heat_map).
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data + lVar12 * 0x18) +
                    lVar9 * 8);
              lVar10 = lVar10 + 1;
            } while (lVar8 >> 3 != lVar10);
          }
          uVar11 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          uVar6 = uVar11 >> 1;
          if ((local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start) &&
             (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + uVar6 !=
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish)) {
            lVar8 = 0x3f;
            if (uVar11 != 0) {
              for (; uVar11 >> lVar8 == 0; lVar8 = lVar8 + -1) {
              }
            }
            std::
            __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
            uVar6 = (ulong)((long)local_60.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_60.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) >> 1;
            pvVar5 = local_48.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          pdVar2 = pvVar5[lVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar2[lVar9] =
               local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar6];
          lVar9 = lVar9 + 1;
          pvVar7 = local_48.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        } while (lVar9 != (long)pvVar5[lVar12].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != ((long)pvVar7 - (long)pvVar5 >> 3) * -0x5555555555555555);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->heat_map,&local_48);
  pPVar3 = *(maps->
            super__Vector_base<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*,_std::allocator<Gudhi::Persistence_representations::Persistence_heat_maps<Gudhi::Persistence_representations::constant_scaling_function>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dVar4 = pPVar3->max_;
  this->min_ = pPVar3->min_;
  this->max_ = dVar4;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::compute_median(const std::vector<Persistence_heat_maps*>& maps) {
  std::vector<std::vector<double> > heat_maps = this->check_and_initialize_maps(maps);

  std::vector<double> to_compute_median(maps.size());
  for (size_t i = 0; i != heat_maps.size(); ++i) {
    for (size_t j = 0; j != heat_maps[i].size(); ++j) {
      for (size_t map_no = 0; map_no != maps.size(); ++map_no) {
        to_compute_median[map_no] = maps[map_no]->heat_map[i][j];
      }
      std::nth_element(to_compute_median.begin(), to_compute_median.begin() + to_compute_median.size() / 2,
                       to_compute_median.end());
      heat_maps[i][j] = to_compute_median[to_compute_median.size() / 2];
    }
  }
  this->heat_map = heat_maps;
  this->min_ = maps[0]->min_;
  this->max_ = maps[0]->max_;
}